

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_dpb.c
# Opt level: O3

void h264e_dpb_build_list(H264eDpb *dpb,EncCpbStatus *cpb)

{
  H264eDpbFrm **list;
  H264eDpbFrm **list_00;
  ushort uVar1;
  ushort uVar2;
  H264eDpbFrm *pHVar3;
  uint uVar4;
  H264eDpbFrm *pHVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  char *fmt;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  EncFrmStatus *in_stack_ffffffffffffff88;
  EncFrmStatus *frm;
  undefined8 uVar13;
  undefined4 uVar14;
  H264eRplmo local_48;
  H264eDpbFrm **local_38;
  
  if ((h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264e_dpb","enter %p\n","h264e_dpb_build_list",dpb);
  }
  dpb->list[0xe] = (H264eDpbFrm *)0x0;
  dpb->list[0xf] = (H264eDpbFrm *)0x0;
  dpb->list[0xc] = (H264eDpbFrm *)0x0;
  dpb->list[0xd] = (H264eDpbFrm *)0x0;
  dpb->list[10] = (H264eDpbFrm *)0x0;
  dpb->list[0xb] = (H264eDpbFrm *)0x0;
  dpb->list[8] = (H264eDpbFrm *)0x0;
  dpb->list[9] = (H264eDpbFrm *)0x0;
  dpb->list[6] = (H264eDpbFrm *)0x0;
  dpb->list[7] = (H264eDpbFrm *)0x0;
  dpb->list[4] = (H264eDpbFrm *)0x0;
  dpb->list[5] = (H264eDpbFrm *)0x0;
  dpb->list[2] = (H264eDpbFrm *)0x0;
  dpb->list[3] = (H264eDpbFrm *)0x0;
  dpb->list[0] = (H264eDpbFrm *)0x0;
  dpb->list[1] = (H264eDpbFrm *)0x0;
  if (((ulong)cpb->curr & 0x10) == 0) {
    if ((h264e_debug >> 9 & 1) != 0) {
      _mpp_log_l(4,"h264e_dpb","cpb init scaning start\n","h264e_dpb_build_list");
    }
    local_38 = dpb->list;
    list = dpb->ltref;
    list_00 = dpb->stref;
    lVar11 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar12 = 0;
    do {
      if ((cpb->init[uVar9].val & 1) != 0) {
        if ((cpb->init[uVar9].val & 0x40) != 0) {
          in_stack_ffffffffffffff88 =
               (EncFrmStatus *)CONCAT44((int)((ulong)in_stack_ffffffffffffff88 >> 0x20),0xfc);
          _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,"!frm->is_non_ref",
                     "h264e_dpb_build_list",in_stack_ffffffffffffff88);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0023754e;
        }
        if ((h264e_debug & 0x200) != 0) {
          uVar8 = cpb->init[uVar9].val;
          in_stack_ffffffffffffff88 =
               (EncFrmStatus *)
               (CONCAT44((int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)uVar8) &
               0xffffffff00000001);
          _mpp_log_l(4,"h264e_dpb","idx %d frm %d valid %d is_non_ref %d lt_ref %d\n",
                     "h264e_dpb_build_list",uVar9 & 0xffffffff,uVar8 >> 0x30,
                     in_stack_ffffffffffffff88,(uint)(uVar8 >> 6) & 1,(uint)(uVar8 >> 7) & 1);
        }
        frm = (EncFrmStatus *)((long)cpb->init + lVar11);
        pHVar5 = find_cpb_frame(dpb,frm);
        if (((ulong)cpb->init[uVar9] & 0x80) == 0) {
          lVar7 = (long)(int)uVar10;
          uVar10 = uVar10 + 1;
          list_00[lVar7] = pHVar5;
          pHVar5->status = cpb->init[uVar9];
          if ((h264e_debug & 0x200) != 0) {
            fmt = "found st %d st_size %d %p\n";
            uVar4 = uVar10;
LAB_00237060:
            _mpp_log_l(4,"h264e_dpb",fmt,"h264e_dpb_build_list",uVar9 & 0xffffffff,(ulong)uVar4,frm)
            ;
            in_stack_ffffffffffffff88 = frm;
          }
        }
        else {
          lVar7 = (long)(int)uVar12;
          uVar12 = uVar12 + 1;
          list[lVar7] = pHVar5;
          pHVar5->status = cpb->init[uVar9];
          if ((h264e_debug & 0x200) != 0) {
            fmt = "found lt %d lt_size %d %p\n";
            uVar4 = uVar12;
            goto LAB_00237060;
          }
        }
      }
      uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 8;
    } while (uVar9 != 8);
    if ((h264e_debug >> 9 & 1) != 0) {
      _mpp_log_l(4,"h264e_dpb","cpb init scaning done\n","h264e_dpb_build_list");
    }
    if ((h264e_debug >> 8 & 1) != 0) {
      uVar13 = CONCAT44(uVar14,uVar12);
      _mpp_log_l(4,"h264e_dpb","dpb_size %d st_size %d lt_size %d\n","h264e_dpb_build_list",
                 (ulong)(uint)dpb->dpb_size,(ulong)uVar10,uVar13);
      uVar14 = (undefined4)((ulong)uVar13 >> 0x20);
    }
    uVar9 = (ulong)uVar10;
    if (1 < (int)uVar10) {
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","dpb st list before sort\n","h264e_dpb_build_list");
        h264e_dpb_dump_listX(list_00,uVar10);
      }
      qsort(list_00,uVar9,8,cmp_st_list);
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","dpb st list after  sort\n","h264e_dpb_build_list");
        h264e_dpb_dump_listX(list_00,uVar10);
      }
    }
    if (1 < (int)uVar12) {
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","dpb lt list before sort\n","h264e_dpb_build_list");
        h264e_dpb_dump_listX(list,uVar12);
      }
      qsort(list,(ulong)uVar12,8,cmp_lt_list);
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","dpb lt list after  sort\n","h264e_dpb_build_list");
        h264e_dpb_dump_listX(list,uVar12);
      }
    }
    local_38[0xe] = (H264eDpbFrm *)0x0;
    local_38[0xf] = (H264eDpbFrm *)0x0;
    local_38[0xc] = (H264eDpbFrm *)0x0;
    local_38[0xd] = (H264eDpbFrm *)0x0;
    local_38[10] = (H264eDpbFrm *)0x0;
    local_38[0xb] = (H264eDpbFrm *)0x0;
    local_38[8] = (H264eDpbFrm *)0x0;
    local_38[9] = (H264eDpbFrm *)0x0;
    local_38[6] = (H264eDpbFrm *)0x0;
    local_38[7] = (H264eDpbFrm *)0x0;
    local_38[4] = (H264eDpbFrm *)0x0;
    local_38[5] = (H264eDpbFrm *)0x0;
    local_38[2] = (H264eDpbFrm *)0x0;
    local_38[3] = (H264eDpbFrm *)0x0;
    *local_38 = (H264eDpbFrm *)0x0;
    local_38[1] = (H264eDpbFrm *)0x0;
    if ((int)uVar10 < 1) {
      uVar9 = 0;
    }
    else {
      memmove(local_38,list_00,uVar9 * 8);
    }
    if (0 < (int)uVar12) {
      uVar8 = 0;
      do {
        dpb->list[uVar9 + uVar8] = list[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar12 != uVar8);
    }
    dpb->st_size = uVar10;
    dpb->lt_size = uVar12;
    if (dpb->dpb_size < (int)(uVar10 + uVar12)) {
      uVar13 = CONCAT44(uVar14,0x139);
      _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "dpb->dpb_size >= st_size + lt_size","h264e_dpb_build_list",uVar13);
      uVar14 = (undefined4)((ulong)uVar13 >> 0x20);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0023754e;
    }
    if ((h264e_debug & 0x200) != 0) {
      h264e_dpb_dump_list(dpb);
    }
    h264e_reorder_wr_rewind(dpb->reorder);
    if (dpb->st_size + dpb->lt_size == 0) {
      if ((h264e_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264e_dpb","refer NULL\n","h264e_dpb_build_list");
      }
    }
    else {
      pHVar5 = dpb->curr;
      pHVar3 = dpb->refr;
      uVar1 = *(ushort *)((long)&pHVar3->status + 6);
      uVar2 = *(ushort *)((long)&dpb->list[0]->status + 6);
      if ((h264e_debug & 0x200) != 0) {
        uVar13 = CONCAT44(uVar14,(uint)uVar1);
        _mpp_log_l(4,"h264e_dpb","refer curr %d def %d set %d reorder %d\n","h264e_dpb_build_list",
                   (ulong)*(ushort *)((long)&pHVar5->status + 6),(ulong)uVar2,uVar13,
                   (uint)((ulong)uVar2 != (ulong)uVar1));
        uVar14 = (undefined4)((ulong)uVar13 >> 0x20);
      }
      if ((uint)uVar2 != (uint)uVar1) {
        uVar9 = (pHVar3->status).val;
        if ((h264e_debug & 0x200) != 0) {
          _mpp_log_l(4,"h264e_dpb","reorder to frm %d\n","h264e_dpb_build_list",uVar9 >> 0x30);
          uVar9 = (pHVar3->status).val;
        }
        uVar10 = (uint)uVar9;
        if ((uVar9 & 0x40) != 0) {
          uVar13 = CONCAT44(uVar14,0x153);
          _mpp_log_l(2,"h264e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "!refr->status.is_non_ref","h264e_dpb_build_list",uVar13);
          uVar14 = (undefined4)((ulong)uVar13 >> 0x20);
          if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0023754e:
            abort();
          }
          uVar10 = (uint)(pHVar3->status).val;
        }
        if ((char)uVar10 < '\0') {
          local_48.modification_of_pic_nums_idc = 2;
          local_48.long_term_pic_idx = uVar10 >> 8 & 0xf;
          if ((h264e_debug & 0x200) != 0) {
            _mpp_log_l(4,"h264e_dpb","reorder lt idx %d \n","h264e_dpb_build_list");
          }
        }
        else {
          uVar10 = pHVar5->frame_num;
          uVar12 = pHVar3->frame_num;
          iVar6 = uVar10 - uVar12;
          local_48.modification_of_pic_nums_idc = (RK_S32)(iVar6 == 0 || (int)uVar10 < (int)uVar12);
          local_48.abs_diff_pic_num_minus1 = -iVar6;
          if (0 < iVar6) {
            local_48.abs_diff_pic_num_minus1 = iVar6;
          }
          local_48.abs_diff_pic_num_minus1 = local_48.abs_diff_pic_num_minus1 + -1;
          if ((h264e_debug & 0x200) != 0) {
            _mpp_log_l(4,"h264e_dpb","reorder st cur %d refr %d diff - 1 %d\n",
                       "h264e_dpb_build_list",(ulong)uVar10,(ulong)uVar12,
                       CONCAT44(uVar14,local_48.abs_diff_pic_num_minus1));
          }
        }
        h264e_reorder_wr_op(dpb->reorder,&local_48);
      }
    }
    if ((h264e_debug & 0x100) != 0) {
      _mpp_log_l(4,"h264e_dpb","leave %p\n","h264e_dpb_build_list",dpb);
    }
  }
  else if ((h264e_debug >> 8 & 1) != 0) {
    _mpp_log_l(4,"h264e_dpb","leave %p\n","h264e_dpb_build_list",dpb);
    return;
  }
  return;
}

Assistant:

void h264e_dpb_build_list(H264eDpb *dpb, EncCpbStatus *cpb)
{
    RK_S32 i, j;
    RK_S32 st_size = 0;
    RK_S32 lt_size = 0;

    h264e_dbg_dpb("enter %p\n", dpb);

    /* clear list */
    memset(dpb->list, 0, sizeof(dpb->list));

    if (cpb->curr.is_intra) {
        h264e_dbg_dpb("leave %p\n", dpb);
        return ;
    }

    // 2.1 init list
    // 2.1.1 found all short term and long term ref
    h264e_dbg_list("cpb init scaning start\n");

    for (i = 0; i < MAX_CPB_REFS; i++) {
        EncFrmStatus *frm = &cpb->init[i];

        if (!frm->valid)
            continue;

        mpp_assert(!frm->is_non_ref);

        h264e_dbg_list("idx %d frm %d valid %d is_non_ref %d lt_ref %d\n",
                       i, frm->seq_idx, frm->valid, frm->is_non_ref, frm->is_lt_ref);

        H264eDpbFrm *p = find_cpb_frame(dpb, frm);
        if (!frm->is_lt_ref) {
            dpb->stref[st_size++] = p;
            p->status.val = frm->val;
            h264e_dbg_list("found st %d st_size %d %p\n", i, st_size, frm);
        } else {
            dpb->ltref[lt_size++] = p;
            p->status.val = frm->val;
            h264e_dbg_list("found lt %d lt_size %d %p\n", i, lt_size, frm);
        }
    }

    h264e_dbg_list("cpb init scaning done\n");
    h264e_dbg_dpb("dpb_size %d st_size %d lt_size %d\n", dpb->dpb_size, st_size, lt_size);

    // sort st list
    if (st_size > 1) {
        if (h264e_debug & H264E_DBG_LIST) {
            mpp_log_f("dpb st list before sort\n");
            h264e_dpb_dump_listX(dpb->stref, st_size);
        }

        qsort(dpb->stref, st_size, sizeof(dpb->stref[0]), cmp_st_list);

        if (h264e_debug & H264E_DBG_LIST) {
            mpp_log_f("dpb st list after  sort\n");
            h264e_dpb_dump_listX(dpb->stref, st_size);
        }
    }

    if (lt_size > 1) {
        if (h264e_debug & H264E_DBG_LIST) {
            mpp_log_f("dpb lt list before sort\n");
            h264e_dpb_dump_listX(dpb->ltref, lt_size);
        }

        qsort(dpb->ltref, lt_size, sizeof(dpb->ltref[0]), cmp_lt_list);

        if (h264e_debug & H264E_DBG_LIST) {
            mpp_log_f("dpb lt list after  sort\n");
            h264e_dpb_dump_listX(dpb->ltref, lt_size);
        }
    }

    // generate list before reorder
    memset(dpb->list, 0, sizeof(dpb->list));
    j = 0;
    for (i = 0; i < st_size; i++)
        dpb->list[j++] = dpb->stref[i];

    for (i = 0; i < lt_size; i++)
        dpb->list[j++] = dpb->ltref[i];

    dpb->st_size = st_size;
    dpb->lt_size = lt_size;

    mpp_assert(dpb->dpb_size >= st_size + lt_size);

    if (h264e_debug & H264E_DBG_LIST)
        h264e_dpb_dump_list(dpb);

    /* generate syntax */
    h264e_reorder_wr_rewind(dpb->reorder);

    if (dpb->st_size + dpb->lt_size) {
        H264eDpbFrm *curr = dpb->curr;
        H264eDpbFrm *refr = dpb->refr;
        H264eDpbFrm *def_ref = dpb->list[0];

        RK_S32 curr_frm_cnt = curr->status.seq_idx;
        RK_S32 set_ref_frm_cnt = refr->status.seq_idx;
        RK_S32 def_ref_frm_cnt = def_ref->status.seq_idx;

        h264e_dbg_list("refer curr %d def %d set %d reorder %d\n",
                       curr_frm_cnt, def_ref_frm_cnt, set_ref_frm_cnt,
                       (def_ref_frm_cnt != set_ref_frm_cnt));

        if (def_ref_frm_cnt != set_ref_frm_cnt) {
            H264eRplmo op;

            h264e_dbg_list("reorder to frm %d\n", refr->status.seq_idx);

            mpp_assert(!refr->status.is_non_ref);

            op.modification_of_pic_nums_idc = (refr->status.is_lt_ref) ? (2) : (0);
            if (refr->status.is_lt_ref) {
                op.modification_of_pic_nums_idc = 2;
                op.long_term_pic_idx = refr->status.lt_idx;

                h264e_dbg_list("reorder lt idx %d \n", op.long_term_pic_idx);
            } else {
                op.modification_of_pic_nums_idc = curr->frame_num > refr->frame_num ? 0 : 1;
                op.abs_diff_pic_num_minus1 = MPP_ABS(curr->frame_num - refr->frame_num) - 1;

                h264e_dbg_list("reorder st cur %d refr %d diff - 1 %d\n",
                               curr->frame_num, refr->frame_num,
                               op.abs_diff_pic_num_minus1);
            }

            h264e_reorder_wr_op(dpb->reorder, &op);
        }
    } else {
        h264e_dbg_list("refer NULL\n");
    }

    h264e_dbg_dpb("leave %p\n", dpb);
}